

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O1

rx_status rx_handle_test_result
                    (rx_context *context,int result,char *file,int line,rx_severity severity,
                    char *failure_msg,char *diagnostic_msg)

{
  rx_summary *prVar1;
  rx_failure *prVar2;
  uint uVar3;
  rx_status rVar4;
  char *pcVar5;
  char **ppcVar6;
  undefined8 unaff_RBX;
  char **ppcVar7;
  undefined4 in_register_00000034;
  char *pcVar8;
  undefined4 in_register_00000084;
  char **__ptr;
  char *pcVar9;
  char *pcVar10;
  char *buf;
  char *local_58;
  uint local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_38 = (char *)CONCAT44(in_register_00000084,severity);
  pcVar8 = (char *)CONCAT44(in_register_00000034,result);
  prVar1 = context->summary;
  if (prVar1 == (rx_summary *)0x0) {
    __assert_fail("context->summary != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x186f,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  prVar2 = prVar1->failures;
  if (prVar2 == (rx_failure *)0x0) {
    __assert_fail("context->summary->failures != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1870,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  prVar1->assessed_count = prVar1->assessed_count + 1;
  rVar4 = RX_SUCCESS;
  if (result == 0) {
    __ptr = &prVar2[-1].msg;
    pcVar5 = prVar2[-1].msg + 1;
    local_4c = line;
    local_40 = failure_msg;
    if ((ulong)pcVar5 >> 0x3b == 0) {
      pcVar10 = prVar2[-1].diagnostic_msg;
      ppcVar7 = (char **)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
      rVar4 = RX_SUCCESS;
      if (pcVar10 < pcVar5) {
        pcVar8 = pcVar10 + ((ulong)pcVar10 >> 1) + 1;
        pcVar9 = pcVar5;
        if (pcVar5 < pcVar8) {
          pcVar9 = pcVar8;
        }
        if (pcVar8 < pcVar10) {
          pcVar9 = (char *)0x7ffffffffffffff;
        }
        local_48 = file;
        if (pcVar9 < pcVar5) {
          __assert_fail("new_capacity >= requested_capacity",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                        ,0x11ec,
                        "enum rx_status rx__dyn_array_ensure_has_enough_capacity(void **, size_t, size_t, size_t, size_t)"
                       );
        }
        if ((char *)0x7ffffffffffffff < pcVar9) {
          __assert_fail("new_capacity <= max_capacity",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                        ,0x11ed,
                        "enum rx_status rx__dyn_array_ensure_has_enough_capacity(void **, size_t, size_t, size_t, size_t)"
                       );
        }
        pcVar8 = (char *)((long)pcVar9 << 5 | 0x10);
        ppcVar6 = (char **)realloc(__ptr,(size_t)pcVar8);
        if (ppcVar6 == (char **)0x0) {
          ppcVar7 = (char **)0x0;
          rx__log(RX_LOG_LEVEL_ALL,pcVar8,0x11f3,"failed to reallocate the block\n");
          rVar4 = RX_ERROR_ALLOCATION;
          file = local_48;
        }
        else {
          ppcVar6[1] = pcVar9;
          __ptr = ppcVar6;
          file = local_48;
          rVar4 = RX_SUCCESS;
        }
      }
    }
    else {
      ppcVar7 = (char **)0x0;
      rx__log(RX_LOG_LEVEL_ALL,pcVar8,0x11e2,"the requested capacity is too large\n");
      rVar4 = RX_ERROR_MAX_SIZE_EXCEEDED;
    }
    if ((char)ppcVar7 == '\0') {
      rx__log(RX_LOG_LEVEL_ALL,pcVar8,0x123e,
              "failed to reserve a large enough capacity for the test failure array (requested capacity: %lu)\n"
              ,*__ptr + 1);
    }
    else {
      prVar1->failures = (rx_failure *)(__ptr + 2);
      ppcVar7 = __ptr + (long)*__ptr * 4 + 2;
      *__ptr = *__ptr + 1;
      rVar4 = RX_SUCCESS;
    }
    if (rVar4 == RX_SUCCESS) {
      if (prVar1->failures == (rx_failure *)0x0) {
        __assert_fail("array != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                      ,0x1221,
                      "void rx__test_failure_array_get_size(size_t *, const struct rx_failure *)");
      }
      prVar1->failure_count = (rx_size)prVar1->failures[-1].msg;
      pcVar8 = file;
      rVar4 = rx__str_copy(&local_58,file);
      uVar3 = local_4c;
      pcVar5 = local_58;
      if (rVar4 != RX_SUCCESS) {
        rx__log(RX_LOG_LEVEL_ERROR,pcVar8,0x1891,
                "failed to allocate the file name for the test located at %s:%d\n",file,
                (ulong)local_4c);
        pcVar5 = (char *)0x0;
      }
      pcVar8 = local_40;
      *ppcVar7 = pcVar5;
      *(uint *)(ppcVar7 + 1) = uVar3;
      *(undefined4 *)((long)ppcVar7 + 0xc) = 1;
      if (local_38 == (char *)0x0) {
        ppcVar7[2] = (char *)0x0;
      }
      else {
        pcVar5 = local_38;
        rVar4 = rx__str_copy(&local_58,local_38);
        pcVar10 = local_58;
        if (rVar4 != RX_SUCCESS) {
          rx__log(RX_LOG_LEVEL_ERROR,pcVar5,0x18a5,
                  "failed to allocate the failure message for the test located at %s:%d\n",file,
                  (ulong)uVar3);
          pcVar10 = (char *)0x0;
        }
        ppcVar7[2] = pcVar10;
      }
      if (pcVar8 == (char *)0x0) {
        ppcVar7[3] = (char *)0x0;
        rVar4 = RX_SUCCESS;
      }
      else {
        rVar4 = rx__str_copy(&local_58,pcVar8);
        if (rVar4 != RX_SUCCESS) {
          rx__log(RX_LOG_LEVEL_ERROR,pcVar8,0x18b6,
                  "failed to allocate the diagnostic message for the test located at %s:%d\n",file,
                  (ulong)uVar3);
          local_58 = (char *)0x0;
        }
        ppcVar7[3] = local_58;
        rVar4 = RX_SUCCESS;
      }
    }
    else {
      prVar1->error = "failed to extend the test failure array";
      rx__log(RX_LOG_LEVEL_ERROR,pcVar8,0x1882,
              "failed to extend the test failure array for the test located at %s:%d\n",file,
              (ulong)local_4c);
    }
  }
  return rVar4;
}

Assistant:

RX__MAYBE_UNUSED RX__STORAGE enum rx_status
rx_handle_test_result(struct rx_context *context,
                      int result,
                      const char *file,
                      int line,
                      enum rx_severity severity,
                      const char *failure_msg,
                      const char *diagnostic_msg)
{
    enum rx_status status;
    struct rx_summary *summary;
    struct rx_failure *failure;
    size_t failure_count;

    RX_ASSERT(context != NULL);
    RX_ASSERT(context->summary != NULL);
    RX_ASSERT(context->summary->failures != NULL);
    RX_ASSERT(file != NULL);

    summary = context->summary;

    ++summary->assessed_count;

    if (result) {
        return RX_SUCCESS;
    }

    status
        = rx__test_failure_array_extend_back(&failure, &summary->failures, 1);
    if (status != RX_SUCCESS) {
        summary->error = "failed to extend the test failure array\0";
        RX__LOG_ERROR_2("failed to extend the test failure array for the test "
                        "located at %s:%d\n",
                        file,
                        line);
        return status;
    }

    rx__test_failure_array_get_size(&failure_count, summary->failures);
    summary->failure_count = failure_count;

    {
        char *buf;

        status = rx__str_copy(&buf, file);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the file name for the test "
                            "located at %s:%d\n",
                            file,
                            line);
            failure->file = NULL;
        } else {
            failure->file = buf;
        }
    }

    failure->line = line;
    failure->severity = severity;

    if (failure_msg == NULL) {
        failure->msg = NULL;
    } else {
        char *buf;

        status = rx__str_copy(&buf, failure_msg);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the failure message for "
                            "the test located at %s:%d\n",
                            file,
                            line);
            failure->msg = NULL;
        } else {
            failure->msg = buf;
        }
    }

    if (diagnostic_msg == NULL) {
        failure->diagnostic_msg = NULL;
    } else {
        char *buf;

        status = rx__str_copy(&buf, diagnostic_msg);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the diagnostic message for "
                            "the test located at %s:%d\n",
                            file,
                            line);
            failure->diagnostic_msg = NULL;
        } else {
            failure->diagnostic_msg = buf;
        }
    }

    return RX_SUCCESS;
}